

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O3

void Abc_GraphDeriveGiaDump(Vec_Wec_t *vNodes,Vec_Int_t *vEdges,int Size)

{
  Gia_Man_t *pInit;
  char pFileName [100];
  char acStack_88 [112];
  
  pInit = Abc_GraphDeriveGia(vNodes,vEdges);
  sprintf(acStack_88,"grid_%dx%d_e%03d.aig",(ulong)(uint)Size);
  Gia_AigerWrite(pInit,acStack_88,0,0,0);
  Gia_ManStop(pInit);
  printf("Finished dumping AIG into file \"%s\".\n",acStack_88);
  return;
}

Assistant:

void Abc_GraphDeriveGiaDump( Vec_Wec_t * vNodes, Vec_Int_t * vEdges, int Size )
{
    char pFileName[100];
    Gia_Man_t * pGia = Abc_GraphDeriveGia( vNodes, vEdges );
    sprintf( pFileName, "grid_%dx%d_e%03d.aig", Size, Size, Vec_IntSize(vEdges)/2 );
    Gia_AigerWrite( pGia, pFileName, 0, 0, 0 );
    Gia_ManStop( pGia );
    printf( "Finished dumping AIG into file \"%s\".\n", pFileName );
}